

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

deUint32 __thiscall
sglr::ReferenceContext::blitResolveMultisampleFramebuffer
          (ReferenceContext *this,deUint32 mask,IVec4 *srcRect,IVec4 *dstRect,bool flipX,bool flipY)

{
  ChannelOrder CVar1;
  uint uVar2;
  TextureFormat format;
  ChannelOrder CVar3;
  bool bVar4;
  bool bVar5;
  TextureChannelClass TVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  MultisampleConstPixelBufferAccess src;
  PixelBufferAccess dst;
  Vec4 p;
  ConstPixelBufferAccess local_88;
  TextureFormat local_60;
  TextureFormat srcFmt;
  
  if ((mask >> 0xe & 1) == 0) goto LAB_0098a81e;
  getReadColorbuffer((MultisamplePixelBufferAccess *)&p,this);
  rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&p,
                   srcRect->m_data[0],srcRect->m_data[1],srcRect->m_data[2],srcRect->m_data[3]);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            (&src,(MultisamplePixelBufferAccess *)&dst);
  getDrawColorbuffer((MultisamplePixelBufferAccess *)&local_88,this);
  rr::MultisamplePixelBufferAccess::toSinglesampleAccess
            ((PixelBufferAccess *)&p,(MultisamplePixelBufferAccess *)&local_88);
  tcu::getSubregion(&dst,(PixelBufferAccess *)&p,dstRect->m_data[0],dstRect->m_data[1],
                    dstRect->m_data[2],dstRect->m_data[3]);
  TVar6 = tcu::getTextureChannelClass(dst.super_ConstPixelBufferAccess.m_format.type);
  format.type = src.m_access.m_format.type;
  format.order = src.m_access.m_format.order;
  bVar4 = tcu::isSRGB(format);
  bVar5 = tcu::isSRGB(dst.super_ConstPixelBufferAccess.m_format);
  if ((this->m_sRGBUpdateEnabled == true) &&
     (((this->super_Context).m_type.super_ApiType.m_bits & 0x300) == 0)) {
    bVar7 = 1;
  }
  else {
    if (src.m_access.m_format.order == sRGB) {
      uVar10 = 7;
    }
    else if (src.m_access.m_format.order == sRGBA) {
      uVar10 = 8;
    }
    else {
      uVar10 = (ulong)src.m_access.m_format.order;
    }
    srcFmt = (TextureFormat)((ulong)src.m_access.m_format.type << 0x20 | uVar10);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&local_88,&srcFmt,src.m_access.m_size.m_data[0],src.m_access.m_size.m_data[1],
               src.m_access.m_size.m_data[2],src.m_access.m_pitch.m_data[1],
               src.m_access.m_pitch.m_data[2],src.m_access.m_data);
    p.m_data[0] = (float)local_88.m_format.order;
    p.m_data[1] = (float)local_88.m_format.type;
    p.m_data[2] = (float)local_88.m_size.m_data[0];
    p.m_data[3] = (float)local_88.m_size.m_data[1];
    rr::MultisampleConstPixelBufferAccess::fromMultisampleAccess((ConstPixelBufferAccess *)&p);
    src.m_access.m_data = local_88.m_data;
    src.m_access.m_size.m_data[2] = local_88.m_size.m_data[2];
    src.m_access.m_pitch.m_data[0] = local_88.m_pitch.m_data[0];
    src.m_access.m_pitch.m_data[1] = local_88.m_pitch.m_data[1];
    src.m_access.m_pitch.m_data[2] = local_88.m_pitch.m_data[2];
    src.m_access.m_format.order = local_88.m_format.order;
    src.m_access.m_format.type = local_88.m_format.type;
    src.m_access.m_size.m_data[0] = local_88.m_size.m_data[0];
    src.m_access.m_size.m_data[1] = local_88.m_size.m_data[1];
    if (dst.super_ConstPixelBufferAccess.m_format.order == sRGBA) {
      uVar10 = 8;
LAB_0098a664:
      uVar9 = (ulong)dst.super_ConstPixelBufferAccess.m_format >> 0x20;
    }
    else {
      if (dst.super_ConstPixelBufferAccess.m_format.order == sRGB) {
        uVar10 = 7;
        goto LAB_0098a664;
      }
      uVar10 = (ulong)dst.super_ConstPixelBufferAccess.m_format & 0xffffffff;
      uVar9 = (ulong)dst.super_ConstPixelBufferAccess.m_format >> 0x20;
    }
    local_60 = (TextureFormat)(uVar9 << 0x20 | uVar10);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_88,&local_60,
               dst.super_ConstPixelBufferAccess.m_size.m_data[0],
               dst.super_ConstPixelBufferAccess.m_size.m_data[1],
               dst.super_ConstPixelBufferAccess.m_size.m_data[2],
               dst.super_ConstPixelBufferAccess.m_pitch.m_data[1],
               dst.super_ConstPixelBufferAccess.m_pitch.m_data[2],
               dst.super_ConstPixelBufferAccess.m_data);
    dst.super_ConstPixelBufferAccess.m_data = local_88.m_data;
    dst.super_ConstPixelBufferAccess.m_size.m_data[2] = local_88.m_size.m_data[2];
    dst.super_ConstPixelBufferAccess.m_pitch.m_data[0] = local_88.m_pitch.m_data[0];
    dst.super_ConstPixelBufferAccess.m_pitch.m_data[1] = local_88.m_pitch.m_data[1];
    dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] = local_88.m_pitch.m_data[2];
    dst.super_ConstPixelBufferAccess.m_format = local_88.m_format;
    dst.super_ConstPixelBufferAccess.m_size.m_data[0] = local_88.m_size.m_data[0];
    dst.super_ConstPixelBufferAccess.m_size.m_data[1] = local_88.m_size.m_data[1];
    bVar7 = 0;
  }
  iVar11 = dstRect->m_data[2];
  if (0 < iVar11) {
    iVar8 = dstRect->m_data[3];
    uVar12 = 0;
    do {
      if (0 < iVar8) {
        iVar11 = 0;
        do {
          uVar2 = srcRect->m_data[2] + ~uVar12;
          if (!flipX) {
            uVar2 = uVar12;
          }
          if ((TVar6 < TEXTURECHANNELCLASS_LAST & 0x13U >> ((byte)TVar6 & 0x1f)) == 0 && !bVar4) {
            tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&p,(int)&src,0,uVar2)
            ;
            tcu::PixelBufferAccess::setPixel(&dst,(IVec4 *)&p,uVar12,iVar11,0);
          }
          else {
            tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&p,(int)&src,0,uVar2);
            if ((bVar5 & bVar7) == 0) {
              local_88.m_format.order = (ChannelOrder)p.m_data[0];
              local_88.m_format.type = (ChannelType)p.m_data[1];
              local_88.m_size.m_data[0] = (int)p.m_data[2];
              local_88.m_size.m_data[1] = (int)p.m_data[3];
            }
            else {
              tcu::linearToSRGB((tcu *)&local_88,&p);
            }
            tcu::PixelBufferAccess::setPixel(&dst,(Vec4 *)&local_88,uVar12,iVar11,0);
          }
          iVar11 = iVar11 + 1;
          iVar8 = dstRect->m_data[3];
        } while (iVar11 < iVar8);
        iVar11 = dstRect->m_data[2];
      }
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < iVar11);
  }
LAB_0098a81e:
  if ((mask >> 8 & 1) != 0) {
    getReadDepthbuffer((MultisamplePixelBufferAccess *)&p,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&p,
                     srcRect->m_data[0],srcRect->m_data[1],srcRect->m_data[2],srcRect->m_data[3]);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              (&src,(MultisamplePixelBufferAccess *)&dst);
    getDrawDepthbuffer((MultisamplePixelBufferAccess *)&p,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&p,
                     dstRect->m_data[0],dstRect->m_data[1],dstRect->m_data[2],dstRect->m_data[3]);
    iVar11 = dstRect->m_data[2];
    if (0 < iVar11) {
      iVar8 = dstRect->m_data[3];
      uVar12 = 0;
      do {
        if (0 < iVar8) {
          iVar11 = 0;
          do {
            uVar2 = srcRect->m_data[2] + ~uVar12;
            if (!flipX) {
              uVar2 = uVar12;
            }
            tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&p,(int)&src,0,uVar2);
            tcu::PixelBufferAccess::setPixDepth(&dst,p.m_data[0],0,uVar12,iVar11);
            iVar11 = iVar11 + 1;
            iVar8 = dstRect->m_data[3];
          } while (iVar11 < iVar8);
          iVar11 = dstRect->m_data[2];
        }
        uVar12 = uVar12 + 1;
      } while ((int)uVar12 < iVar11);
    }
  }
  if ((mask >> 10 & 1) != 0) {
    getReadStencilbuffer((MultisamplePixelBufferAccess *)&srcFmt,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&local_88,
                     (MultisamplePixelBufferAccess *)&srcFmt,srcRect->m_data[0],srcRect->m_data[1],
                     srcRect->m_data[2],srcRect->m_data[3]);
    tcu::getEffectiveDepthStencilAccess
              ((PixelBufferAccess *)&src,(PixelBufferAccess *)&local_88,MODE_STENCIL);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)&src);
    rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
              ((MultisampleConstPixelBufferAccess *)&dst,(MultisamplePixelBufferAccess *)&p);
    getDrawStencilbuffer((MultisamplePixelBufferAccess *)&srcFmt,this);
    rr::getSubregion((MultisamplePixelBufferAccess *)&local_88,
                     (MultisamplePixelBufferAccess *)&srcFmt,dstRect->m_data[0],dstRect->m_data[1],
                     dstRect->m_data[2],dstRect->m_data[3]);
    tcu::getEffectiveDepthStencilAccess
              ((PixelBufferAccess *)&src,(PixelBufferAccess *)&local_88,MODE_STENCIL);
    rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)&src);
    iVar11 = dstRect->m_data[2];
    if (0 < iVar11) {
      iVar8 = dstRect->m_data[3];
      uVar12 = 0;
      do {
        if (0 < iVar8) {
          iVar11 = 0;
          do {
            uVar2 = srcRect->m_data[2] + ~uVar12;
            if (!flipX) {
              uVar2 = uVar12;
            }
            tcu::ConstPixelBufferAccess::getPixelInt(&src.m_access,(int)&dst,0,uVar2);
            CVar3 = src.m_access.m_format.order;
            CVar1 = this->m_stencil[0].writeMask;
            tcu::ConstPixelBufferAccess::getPixelInt
                      (&src.m_access,(int)(PixelBufferAccess *)&p,0,uVar12);
            src.m_access.m_format.order =
                 (CVar3 ^ src.m_access.m_format.order) & CVar1 ^ src.m_access.m_format.order;
            src.m_access.m_format.type = SNORM_INT8;
            src.m_access.m_size.m_data[0] = 0;
            src.m_access.m_size.m_data[1] = 0;
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)&p,(IVec4 *)&src.m_access,0,uVar12,iVar11);
            iVar11 = iVar11 + 1;
            iVar8 = dstRect->m_data[3];
          } while (iVar11 < iVar8);
          iVar11 = dstRect->m_data[2];
        }
        uVar12 = uVar12 + 1;
      } while ((int)uVar12 < iVar11);
    }
  }
  return 0;
}

Assistant:

deUint32 ReferenceContext::blitResolveMultisampleFramebuffer (deUint32 mask, const IVec4& srcRect, const IVec4& dstRect, bool flipX, bool flipY)
{
	if (mask & GL_COLOR_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src			= rr::getSubregion(getReadColorbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w());
		tcu::PixelBufferAccess					dst			= tcu::getSubregion(getDrawColorbuffer().toSinglesampleAccess(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w());
		tcu::TextureChannelClass				dstClass	= tcu::getTextureChannelClass(dst.getFormat().type);
		bool									dstIsFloat	= dstClass == tcu::TEXTURECHANNELCLASS_FLOATING_POINT		||
															  dstClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
															  dstClass == tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT;
		bool									srcIsSRGB	= tcu::isSRGB(src.raw().getFormat());
		bool									dstIsSRGB	= tcu::isSRGB(dst.getFormat());
		const bool								convertSRGB	= m_sRGBUpdateEnabled && glu::isContextTypeES(getType());

		if (!convertSRGB)
		{
			tcu::ConstPixelBufferAccess	srcRaw	= src.raw();
			tcu::TextureFormat			srcFmt	= toNonSRGBFormat(srcRaw.getFormat());

			srcRaw	= tcu::ConstPixelBufferAccess(srcFmt, srcRaw.getWidth(), srcRaw.getHeight(), srcRaw.getDepth(), srcRaw.getRowPitch(), srcRaw.getSlicePitch(), srcRaw.getDataPtr());
			src		= rr::MultisampleConstPixelBufferAccess::fromMultisampleAccess(srcRaw);

			dst		= tcu::PixelBufferAccess(toNonSRGBFormat(dst.getFormat()), dst.getWidth(), dst.getHeight(), dst.getDepth(), dst.getRowPitch(), dst.getSlicePitch(), dst.getDataPtr());
		}

		for (int x = 0; x < dstRect.z(); ++x)
		for (int y = 0; y < dstRect.w(); ++y)
		{
			int srcX = (flipX) ? (srcRect.z() - x - 1) : (x);
			int srcY = (flipY) ? (srcRect.z() - y - 1) : (y);

			if (dstIsFloat || srcIsSRGB)
			{
				Vec4 p = src.raw().getPixel(0, srcX,srcY);
				dst.setPixel((dstIsSRGB && convertSRGB) ? tcu::linearToSRGB(p) : p, x, y);
			}
			else
				dst.setPixel(src.raw().getPixelInt(0, srcX, srcY), x, y);
		}
	}

	if (mask & GL_DEPTH_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src	= rr::getSubregion(getReadDepthbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w());
		rr::MultisamplePixelBufferAccess		dst	= rr::getSubregion(getDrawDepthbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w());

		for (int x = 0; x < dstRect.z(); ++x)
		for (int y = 0; y < dstRect.w(); ++y)
		{
			int srcX = (flipX) ? (srcRect.z() - x - 1) : (x);
			int srcY = (flipY) ? (srcRect.z() - y - 1) : (y);

			writeDepthOnly(dst, 0, x, y, src.raw().getPixel(0, srcX, srcY).x());
		}
	}

	if (mask & GL_STENCIL_BUFFER_BIT)
	{
		rr::MultisampleConstPixelBufferAccess	src	= getStencilMultisampleAccess(rr::getSubregion(getReadStencilbuffer(), srcRect.x(), srcRect.y(), srcRect.z(), srcRect.w()));
		rr::MultisamplePixelBufferAccess		dst	= getStencilMultisampleAccess(rr::getSubregion(getDrawStencilbuffer(), dstRect.x(), dstRect.y(), dstRect.z(), dstRect.w()));

		for (int x = 0; x < dstRect.z(); ++x)
		for (int y = 0; y < dstRect.w(); ++y)
		{
			int			srcX		= (flipX) ? (srcRect.z() - x - 1) : (x);
			int			srcY		= (flipY) ? (srcRect.z() - y - 1) : (y);
			deUint32	srcStencil	= src.raw().getPixelUint(0, srcX, srcY).x();

			writeMaskedStencil(dst, 0, x, y, srcStencil, m_stencil[rr::FACETYPE_FRONT].writeMask);
		}
	}

	return GL_NO_ERROR;
}